

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ResolutionPass.h
# Opt level: O3

Expression * __thiscall
soul::ResolutionPass::QualifiedIdentifierResolver::visit
          (QualifiedIdentifierResolver *this,DotOperator *d)

{
  pool_ref<soul::AST::Expression> *e;
  Context *args;
  size_t *psVar1;
  Allocator *this_00;
  bool bVar2;
  int iVar3;
  ExpressionKind EVar4;
  long lVar5;
  UnqualifiedName *pUVar6;
  Structure *this_01;
  Expression *pEVar7;
  ComplexMemberRef *unaff_R12;
  string_view memberName;
  pool_ptr<soul::AST::ProcessorBase> processor;
  pool_ptr<soul::AST::ProcessorInstanceRef> processorInstance;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  Type local_2d0;
  string local_2b8;
  undefined1 local_298 [16];
  undefined1 local_288 [72];
  undefined1 local_240 [88];
  bool local_1e8;
  ulong local_1e4;
  undefined3 local_1dc;
  bool local_1d9;
  undefined1 local_1d8 [88];
  CompileMessage local_180;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  e = &d->lhs;
  RewritingASTVisitor::replaceExpression((RewritingASTVisitor *)this,e);
  if ((this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0) {
    if (((e->object != (Expression *)0x0) &&
        (local_2b8._M_dataplus._M_p =
              (pointer)__dynamic_cast(e->object,&AST::Expression::typeinfo,
                                      &AST::ProcessorInstanceRef::typeinfo,0),
        (long *)local_2b8._M_dataplus._M_p != (long *)0x0)) &&
       ((**(code **)(*(long *)local_2b8._M_dataplus._M_p + 0x30))
                  (&local_2d0,local_2b8._M_dataplus._M_p),
       CONCAT44(local_2d0.primitiveType.type,local_2d0._0_4_) != 0)) {
      local_298._0_8_ = local_288 + 8;
      local_298._8_8_ = 0;
      local_288._0_8_ = (ResolutionPass *)0x8;
      local_240._8_8_ = 0;
      local_240._16_8_ = (SourceCodeText *)0x8;
      local_1e8 = false;
      local_1e4 = 0x1010101ffffffff;
      local_1dc._0_1_ = true;
      local_1dc._1_1_ = false;
      local_1dc._2_1_ = true;
      local_1d9 = false;
      local_240._0_8_ = (Structure *)(local_240 + 0x18);
      IdentifierPath::IdentifierPath((IdentifierPath *)local_1d8,(d->rhs->identifier).name);
      unaff_R12 = (ComplexMemberRef *)local_240;
      ArrayWithPreallocation<soul::Identifier,_8UL>::operator=
                ((ArrayWithPreallocation<soul::Identifier,_8UL> *)unaff_R12,
                 (ArrayWithPreallocation<soul::Identifier,_8UL> *)local_1d8);
      local_1d8._8_8_ = 0;
      if ((8 < (ulong)local_1d8._16_8_) && ((Identifier *)local_1d8._0_8_ != (Identifier *)0x0)) {
        operator_delete__((void *)local_1d8._0_8_);
      }
      local_1e8 = true;
      local_1e4 = local_1e4 & 0xffffffff;
      local_1dc._0_1_ = false;
      local_1dc._1_1_ = false;
      local_1dc._2_1_ = true;
      if (CONCAT44(local_2d0.primitiveType.type,local_2d0._0_4_) == 0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      AST::Scope::performFullNameSearch
                ((Scope *)(CONCAT44(local_2d0.primitiveType.type,local_2d0._0_4_) + 0x28),
                 (NameSearch *)local_298,(Statement *)0x0);
      bVar2 = true;
      if (((local_298._8_8_ == 1) && (*(long *)local_298._0_8_ != 0)) &&
         (lVar5 = __dynamic_cast(*(long *)local_298._0_8_,&AST::ASTObject::typeinfo,
                                 &AST::EndpointDeclaration::typeinfo,0), lVar5 != 0)) {
        this_00 = (this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                  allocator;
        args = &(d->super_Expression).super_Statement.super_ASTObject.context;
        pUVar6 = PoolAllocator::
                 allocate<soul::AST::UnqualifiedName,soul::AST::Context&,soul::Identifier&>
                           (&this_00->pool,args,&d->rhs->identifier);
        unaff_R12 = (ComplexMemberRef *)
                    PoolAllocator::
                    allocate<soul::AST::ConnectionEndpointRef,soul::AST::Context&,soul::pool_ptr<soul::AST::ProcessorInstanceRef>&,soul::AST::UnqualifiedName&>
                              (&this_00->pool,args,
                               (pool_ptr<soul::AST::ProcessorInstanceRef> *)&local_2b8,pUVar6);
        bVar2 = false;
      }
      local_240._8_8_ = 0;
      if ((SourceCodeText *)0x8 < (ulong)local_240._16_8_) {
        if ((Structure *)local_240._0_8_ != (Structure *)0x0) {
          operator_delete__((void *)local_240._0_8_);
        }
        local_240._16_8_ = (SourceCodeText *)0x8;
        local_240._0_8_ = (Structure *)(local_240 + 0x18);
      }
      local_298._8_8_ = 0;
      if (((ResolutionPass *)0x8 < (ulong)local_288._0_8_) &&
         ((ComplexMemberRef *)local_298._0_8_ != (ComplexMemberRef *)0x0)) {
        operator_delete__((void *)local_298._0_8_);
      }
      if (!bVar2) {
        return &unaff_R12->super_Expression;
      }
    }
    if ((e->object != (Expression *)0x0) &&
       (lVar5 = __dynamic_cast(e->object,&AST::Expression::typeinfo,&AST::DotOperator::typeinfo,0),
       lVar5 != 0)) {
      if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors
          != true) {
        CompileMessageHelpers::createMessage<>(&local_68,syntax,error,"Invalid endpoint specifier");
        AST::Context::throwError
                  (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_68,false);
      }
      psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails
      ;
      *psVar1 = *psVar1 + 1;
    }
  }
  iVar3 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[3])();
  if ((char)iVar3 == '\0') goto LAB_001ea549;
  pEVar7 = e->object;
  EVar4 = pEVar7->kind;
  if (EVar4 == type) {
    iVar3 = (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar7);
    pEVar7 = e->object;
    if ((char)iVar3 == '\0') {
      EVar4 = pEVar7->kind;
      goto LAB_001ea2ee;
    }
    createTypeMetaFunction
              ((QualifiedIdentifierResolver *)local_298,(UnqualifiedName *)this,
               &d->rhs->super_Expression);
    if ((ComplexMemberRef *)local_298._0_8_ != (ComplexMemberRef *)0x0) {
      return &((ComplexMemberRef *)local_298._0_8_)->super_Expression;
    }
  }
  else {
LAB_001ea2ee:
    if (EVar4 == value) {
      iVar3 = (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[3])(pEVar7);
      pEVar7 = e->object;
      if ((char)iVar3 != '\0') {
        (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[4])(&local_2d0,pEVar7);
        if (local_2d0.category == structure) {
          this_01 = Type::getStructRef(&local_2d0);
          AST::UnqualifiedName::toString_abi_cxx11_((string *)local_298,d->rhs);
          memberName._M_str = (char *)local_298._0_8_;
          memberName._M_len = local_298._8_8_;
          bVar2 = Structure::hasMemberWithName(this_01,memberName);
          if (bVar2) {
            unaff_R12 = (ComplexMemberRef *)
                        PoolAllocator::
                        allocate<soul::AST::StructMemberRef,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::Structure&,std::__cxx11::string>
                                  (&((this->super_ModuleInstanceResolver).
                                     super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                   &(d->super_Expression).super_Statement.super_ASTObject.context,e,
                                   this_01,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_298);
          }
          else if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.
                   ignoreErrors == false) {
            pUVar6 = d->rhs;
            AST::UnqualifiedName::toString_abi_cxx11_((string *)local_1d8,pUVar6);
            Type::getDescription_abi_cxx11_(&local_2b8,&local_2d0);
            CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                      (&local_148,(CompileMessageHelpers *)0x1,none,0x259b5d,local_1d8,&local_2b8,
                       in_stack_fffffffffffffd28);
            AST::Context::throwError
                      (&(pUVar6->super_Expression).super_Statement.super_ASTObject.context,
                       &local_148,false);
          }
          if ((ComplexMemberRef *)local_298._0_8_ != (ComplexMemberRef *)local_288) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_288._0_8_ + 1));
          }
          if (bVar2) goto LAB_001ea50a;
LAB_001ea50e:
          createTypeMetaFunction
                    ((QualifiedIdentifierResolver *)local_298,(UnqualifiedName *)this,
                     &d->rhs->super_Expression);
          bVar2 = (ComplexMemberRef *)local_298._0_8_ == (ComplexMemberRef *)0x0;
          if (!bVar2) {
            unaff_R12 = (ComplexMemberRef *)local_298._0_8_;
          }
        }
        else {
          if (1 < local_2d0.primitiveType.type - complex32) goto LAB_001ea50e;
          AST::UnqualifiedName::toString_abi_cxx11_((string *)local_298,d->rhs);
          iVar3 = std::__cxx11::string::compare(local_298);
          if ((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare(local_298), iVar3 != 0)) {
            pUVar6 = d->rhs;
            AST::UnqualifiedName::toString_abi_cxx11_((string *)local_1d8,pUVar6);
            Type::getDescription_abi_cxx11_(&local_2b8,&local_2d0);
            CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                      (&local_180,(CompileMessageHelpers *)0x1,none,0x27c96c,local_1d8,&local_2b8,
                       in_stack_fffffffffffffd28);
            AST::Context::throwError
                      (&(pUVar6->super_Expression).super_Statement.super_ASTObject.context,
                       &local_180,false);
          }
          unaff_R12 = PoolAllocator::
                      allocate<soul::AST::ComplexMemberRef,soul::AST::Context&,soul::pool_ref<soul::AST::Expression>&,soul::Type&,std::__cxx11::string>
                                (&((this->super_ModuleInstanceResolver).
                                   super_ErrorIgnoringRewritingASTVisitor.allocator)->pool,
                                 &(d->super_Expression).super_Statement.super_ASTObject.context,e,
                                 &local_2d0,
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_298);
          if ((ComplexMemberRef *)local_298._0_8_ != (ComplexMemberRef *)local_288) {
            operator_delete((void *)local_298._0_8_,(ulong)(local_288._0_8_ + 1));
          }
LAB_001ea50a:
          bVar2 = false;
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(local_2d0.structure.object);
        if (!bVar2) {
          return &unaff_R12->super_Expression;
        }
        goto LAB_001ea542;
      }
    }
    iVar3 = (*(pEVar7->super_Statement).super_ASTObject._vptr_ASTObject[9])(pEVar7);
    if ((char)iVar3 != '\0') {
      if ((this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0) {
        return &d->super_Expression;
      }
      AST::UnqualifiedName::toString_abi_cxx11_((string *)local_298,d->rhs);
      iVar3 = std::__cxx11::string::compare((char *)local_298);
      if ((ComplexMemberRef *)local_298._0_8_ != (ComplexMemberRef *)local_288) {
        operator_delete((void *)local_298._0_8_,(ulong)(local_288._0_8_ + 1));
      }
      if (iVar3 == 0) {
        return &d->super_Expression;
      }
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,"No such operation is supported on an endpoint");
      AST::Context::throwError
                (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_a0,false);
    }
    if ((e->object->kind == processor) &&
       (iVar3 = (*(e->object->super_Statement).super_ASTObject._vptr_ASTObject[3])(),
       (char)iVar3 != '\0')) {
      if ((this->currentConnectionEndpoint).object != (SharedEndpoint *)0x0) {
        return &d->super_Expression;
      }
      CompileMessageHelpers::createMessage<>
                (&local_d8,syntax,error,"No such operation is supported on a processor");
      AST::Context::throwError
                (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_d8,false);
    }
  }
LAB_001ea542:
  if ((this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.ignoreErrors ==
      false) {
    CompileMessageHelpers::createMessage<>
              (&local_110,syntax,error,"Invalid arguments for the dot operator");
    AST::Context::throwError
              (&(d->super_Expression).super_Statement.super_ASTObject.context,&local_110,false);
  }
LAB_001ea549:
  psVar1 = &(this->super_ModuleInstanceResolver).super_ErrorIgnoringRewritingASTVisitor.numFails;
  *psVar1 = *psVar1 + 1;
  return &d->super_Expression;
}

Assistant:

AST::Expression& visit (AST::DotOperator& d) override
        {
            auto& result = super::visit (d);

            if (std::addressof (result) != std::addressof (d))
                return result;

            if (currentConnectionEndpoint != nullptr)
            {
                if (auto processorInstance = cast<AST::ProcessorInstanceRef> (d.lhs))
                {
                    if (auto processor = processorInstance->getAsProcessor())
                    {
                        AST::Scope::NameSearch search;
                        search.partiallyQualifiedPath = d.rhs.getIdentifierPath();
                        search.stopAtFirstScopeWithResults = true;
                        search.findVariables = false;
                        search.findTypes = false;
                        search.findFunctions = false;
                        search.findNamespaces = false;
                        search.findProcessors = false;
                        search.findProcessorInstances = false;
                        search.findEndpoints = true;

                        processor->performFullNameSearch (search, nullptr);

                        if (search.itemsFound.size() == 1)
                            if (is_type<AST::EndpointDeclaration> (search.itemsFound.front()))
                                return allocator.allocate<AST::ConnectionEndpointRef> (d.context,
                                                                                       processorInstance,
                                                                                       allocator.allocate<AST::UnqualifiedName> (d.context, d.rhs.identifier));
                    }
                }

                if (auto nestedDots = cast<AST::DotOperator> (d.lhs))
                {
                    if (ignoreErrors)
                        ++numFails;
                    else
                        d.context.throwError (Errors::invalidEndpointSpecifier());
                }
            }

            if (failIfNotResolved (d.lhs))
                return result;

            if (AST::isResolvedAsType (d.lhs.get()))
            {
                if (auto metaFunction = createTypeMetaFunction (d.rhs, d.lhs))
                    return *metaFunction;
            }
            else if (AST::isResolvedAsValue (d.lhs.get()))
            {
                auto lhsType = d.lhs->getResultType();

                if (lhsType.isStruct())
                {
                    auto& s = lhsType.getStructRef();
                    auto name = d.rhs.toString();

                    if (s.hasMemberWithName (name))
                        return allocator.allocate<AST::StructMemberRef> (d.context, d.lhs, s, std::move (name));

                    if (! ignoreErrors)
                        d.rhs.context.throwError (Errors::unknownMemberInStruct (d.rhs.toString(), lhsType.getDescription()));
                }
                else if (lhsType.isComplex())
                {
                    auto name = d.rhs.toString();

                    if (name == "real" || name == "imag")
                        return allocator.allocate<AST::ComplexMemberRef> (d.context, d.lhs, lhsType, std::move (name));

                    d.rhs.context.throwError (Errors::unknownMemberInComplex (d.rhs.toString(), lhsType.getDescription()));
                }

                if (auto metaFunction = createTypeMetaFunction (d.rhs, d.lhs))
                    return *metaFunction;
            }
            else if (d.lhs->isOutputEndpoint())
            {
                if (currentConnectionEndpoint != nullptr || d.rhs.toString() == "type")
                    return d;

                d.context.throwError (Errors::noSuchOperationOnEndpoint());
            }
            else if (AST::isResolvedAsProcessor (d.lhs.get()))
            {
                if (currentConnectionEndpoint != nullptr)
                    return d;

                d.context.throwError (Errors::noSuchOperationOnProcessor());
            }

            if (ignoreErrors)
                ++numFails;
            else
                d.context.throwError (Errors::invalidDotArguments());

            return d;
        }